

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void greet_prog_furcas(CHAR_DATA *mob,CHAR_DATA *ch)

{
  int iVar1;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RSI;
  long in_RDI;
  AFFECT_DATA *af;
  bool in_stack_000000bf;
  CHAR_DATA *in_stack_000000c0;
  char *in_stack_00001360;
  CHAR_DATA *in_stack_00001368;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  PC_DATA *arg1;
  
  ch_00 = (CHAR_DATA *)affect_find(*(AFFECT_DATA **)(in_RDI + 0x88),(int)gsn_lesser_demon);
  if ((ch_00 != (CHAR_DATA *)0x0) && (in_RSI == ch_00->next_in_room)) {
    act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
    act((char *)in_RSI,ch_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
    do_say(in_stack_00001368,in_stack_00001360);
    in_RSI->pcdata->lesserdata[3] = 2;
    arg1 = in_RSI->pcdata;
    iVar1 = skill_lookup((char *)ch_00);
    arg1->learned[iVar1] = 1;
    send_to_char((char *)in_RSI,ch_00);
    act((char *)in_RSI,ch_00,arg1,in_stack_ffffffffffffffd8,0);
    extract_char(in_stack_000000c0,in_stack_000000bf);
  }
  return;
}

Assistant:

void greet_prog_furcas(CHAR_DATA *mob, CHAR_DATA *ch)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_lesser_demon);

	if (!af)
		return;

	if (ch != af->owner)
		return;

	act("Eyes wide with amazement and fear, $n leaps backward away from you!", mob, 0, ch, TO_VICT);
	act("Eyes wide with amazement and fear, $n leaps backward away from $N!", mob, 0, ch, TO_NOTVICT);

	do_say(mob, "Do not harm us, we hope it will not!  Here!  Here, take it!");

	ch->pcdata->lesserdata[LESSER_FURCAS] = FAVOR_GRANTED;
	ch->pcdata->learned[skill_lookup("darksight")] = 1;

	send_to_char("Your eyes burn for a moment, and your vision seems somehow sharper.\n\r", ch);
	act("$n shrinks back into nearby shadows and is gone.", mob, 0, 0, TO_ROOM);
	extract_char(mob, true);
}